

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O0

bool (anonymous_namespace)::
     TryGeneratedPaths<cmFindPackageCommand::SearchAppBundlePrefix(std::__cxx11::string_const&)::__0&,(anonymous_namespace)::cmMacProjectDirectoryListGenerator&,(anonymous_namespace)::cmAppendPathSegmentGenerator&,(anonymous_namespace)::cmCaseInsensitiveDirectoryListGenerator>
               (anon_class_8_1_8991fb9c *filesCollector,string *startPath,
               cmMacProjectDirectoryListGenerator *gen,cmAppendPathSegmentGenerator *tail,
               cmCaseInsensitiveDirectoryListGenerator *tail_1)

{
  byte bVar1;
  bool bVar2;
  string local_90;
  int local_5c;
  undefined1 local_58 [8];
  string path;
  cmCaseInsensitiveDirectoryListGenerator *tail_local_1;
  cmAppendPathSegmentGenerator *tail_local;
  cmMacProjectDirectoryListGenerator *gen_local;
  string *startPath_local;
  anon_class_8_1_8991fb9c *filesCollector_local;
  
  path.field_2._8_8_ = tail_1;
  ResetGenerator<(anonymous_namespace)::cmMacProjectDirectoryListGenerator&>(gen);
  anon_unknown.dwarf_56d607::cmDirectoryListGenerator::GetNextCandidate
            ((string *)local_58,&gen->super_cmDirectoryListGenerator,startPath);
  do {
    bVar1 = std::__cxx11::string::empty();
    if (((bVar1 ^ 0xff) & 1) == 0) {
      local_5c = 2;
LAB_003eaae9:
      std::__cxx11::string::~string((string *)local_58);
      if (local_5c != 1) {
        filesCollector_local._7_1_ = 0;
      }
      return (bool)(filesCollector_local._7_1_ & 1);
    }
    ResetGenerator<(anonymous_namespace)::cmAppendPathSegmentGenerator&,(anonymous_namespace)::cmCaseInsensitiveDirectoryListGenerator>
              (tail,(cmCaseInsensitiveDirectoryListGenerator *)path.field_2._8_8_);
    bVar2 = TryGeneratedPaths<cmFindPackageCommand::SearchAppBundlePrefix(std::__cxx11::string_const&)::__0&,(anonymous_namespace)::cmAppendPathSegmentGenerator&,(anonymous_namespace)::cmCaseInsensitiveDirectoryListGenerator>
                      (filesCollector,(string *)local_58,tail,
                       (cmCaseInsensitiveDirectoryListGenerator *)path.field_2._8_8_);
    if (bVar2) {
      filesCollector_local._7_1_ = 1;
      local_5c = 1;
      goto LAB_003eaae9;
    }
    anon_unknown.dwarf_56d607::cmDirectoryListGenerator::GetNextCandidate
              (&local_90,&gen->super_cmDirectoryListGenerator,startPath);
    std::__cxx11::string::operator=((string *)local_58,(string *)&local_90);
    std::__cxx11::string::~string((string *)&local_90);
  } while( true );
}

Assistant:

bool TryGeneratedPaths(CallbackFn&& filesCollector,
                       const std::string& startPath, Generator&& gen,
                       Rest&&... tail)
{
  ResetGenerator(std::forward<Generator&&>(gen));
  for (auto path = gen.GetNextCandidate(startPath); !path.empty();
       path = gen.GetNextCandidate(startPath)) {
    ResetGenerator(std::forward<Rest&&>(tail)...);
    if (TryGeneratedPaths(std::forward<CallbackFn&&>(filesCollector), path,
                          std::forward<Rest&&>(tail)...)) {
      return true;
    }
  }
  return false;
}